

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O3

void wirehair::AddInvertibleGF2Matrix(uint64_t *matrix,uint offset,uint pitchWords,uint n)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong *puVar14;
  ulong *puVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  
  if (n < 0x200) {
    if (n != 0) {
      uVar20 = (ulong)(offset & 0x3f);
      uVar9 = 0x40 - (offset & 0x3f);
      uVar7 = ~(-1L << ((ulong)n & 0x3f));
      lVar1 = (ulong)(byte)kInvertibleMatrixSeeds[n] * 2 + 1;
      puVar13 = matrix + (offset >> 6);
      puVar15 = matrix + (ulong)(offset >> 6) + 1;
      uVar11 = lVar1 * 0x5851f42d4c957f2e;
      uVar19 = n;
      if (uVar9 < n) {
        uVar19 = uVar9;
      }
      if (0x3f < n) {
        uVar7 = 0xffffffffffffffff;
        uVar19 = uVar9;
      }
      uVar18 = 0;
      do {
        uVar16 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
        bVar4 = (byte)(uVar11 >> 0x3b);
        uVar11 = uVar11 * 0x5851f42d4c957f2d + lVar1;
        uVar6 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
        bVar5 = (byte)(uVar11 >> 0x3b);
        uVar11 = uVar11 * 0x5851f42d4c957f2d + lVar1;
        uVar17 = CONCAT44(uVar6 >> bVar5 | uVar6 << 0x20 - bVar5,
                          uVar16 >> bVar4 | uVar16 << 0x20 - bVar4);
        *puVar13 = *puVar13 ^ (uVar17 & uVar7) << uVar20;
        uVar12 = (ulong)(n - uVar19);
        puVar14 = puVar15;
        if (n != uVar19) {
          do {
            uVar8 = uVar17 >> ((ulong)uVar9 & 0x3f);
            if (uVar20 == 0) {
              uVar8 = 0;
            }
            if (uVar20 < uVar12) {
              uVar16 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
              bVar4 = (byte)(uVar11 >> 0x3b);
              uVar11 = uVar11 * 0x5851f42d4c957f2d + lVar1;
              uVar6 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
              bVar5 = (byte)(uVar11 >> 0x3b);
              uVar11 = uVar11 * 0x5851f42d4c957f2d + lVar1;
              uVar17 = CONCAT44(uVar6 >> bVar5 | uVar6 << 0x20 - bVar5,
                                uVar16 >> bVar4 | uVar16 << 0x20 - bVar4);
              uVar8 = uVar8 | uVar17 << uVar20;
            }
            else {
              uVar17 = 0;
            }
            uVar10 = ~(-1L << (uVar12 & 0x3f));
            if (0x3f < uVar12) {
              uVar10 = 0xffffffffffffffff;
            }
            *puVar14 = *puVar14 ^ uVar10 & uVar8;
            bVar3 = 0x40 < uVar12;
            uVar12 = uVar12 - 0x40;
            puVar14 = puVar14 + 1;
          } while (bVar3);
        }
        puVar15 = puVar15 + pitchWords;
        uVar18 = uVar18 + 1;
        puVar13 = puVar13 + pitchWords;
      } while (uVar18 != n);
    }
  }
  else {
    uVar9 = offset + 1;
    uVar18 = 1;
    uVar19 = offset;
    do {
      matrix[uVar19 >> 6] = matrix[uVar19 >> 6] ^ 1L << ((ulong)((offset + uVar18) - 1) & 0x3f);
      if (uVar18 < n) {
        matrix[uVar9 >> 6] = matrix[uVar9 >> 6] ^ 1L << ((ulong)(offset + uVar18) & 0x3f);
      }
      iVar2 = (1 - n) + uVar18;
      matrix = matrix + pitchWords;
      uVar19 = uVar19 + 1;
      uVar9 = uVar9 + 1;
      uVar18 = uVar18 + 1;
    } while (iVar2 != 1);
  }
  return;
}

Assistant:

void AddInvertibleGF2Matrix(
    uint64_t * GF256_RESTRICT matrix, ///< Address of upper left word
    const unsigned offset, ///< Offset in bits to the first sum column
    const unsigned pitchWords, ///< Pitch of the matrix in words
    const unsigned n ///< Number of bits in the matrix to generate
)
{
    // If we do not have this value of n in the table:
    if (n >= kMatrixSeedCount)
    {
        uint64_t * row = matrix;

        // For each row:
        for (unsigned ii = 0; ii < n; ++ii, row += pitchWords)
        {
            // Flip diagonal bit
            const unsigned column_i = offset + ii;
            row[column_i >> 6] ^= (uint64_t)1 << (column_i & 63);

            // Flip an off-diagonal bit also
            if (ii + 1 < n) {
                const unsigned column_j = column_i + 1;
                row[column_j >> 6] ^= (uint64_t)1 << (column_j & 63);
            }
        }

        return;
    }

    // Pull a random matrix out of the lookup table
    const uint8_t seed = kInvertibleMatrixSeeds[n];

    PCGRandom prng;
    prng.Seed(seed);

    const unsigned shift = offset & 63;
    uint64_t * row = matrix + (offset >> 6);

    // For each row to generate:
    for (unsigned row_i = 0; row_i < n; ++row_i, row += pitchWords)
    {
        uint64_t * dest = row;
        unsigned target = n;

        // Unroll the first word
        uint64_t prev = 0;

        // Generate first word
        const uint64_t word0 = Random64(prng);

        uint64_t temp0 = word0;

        unsigned written0 = 64 - shift;

        // Handle short writes
        if (target < 64) {
            temp0 &= ((uint64_t)1 << target) - 1;
            if (written0 > target) {
                written0 = target;
            }
        }

        // Add partial word into front
        *dest++ ^= temp0 << shift;

        target -= written0;
        prev = word0;

        if (target <= 0) {
            continue;
        }

        // For each remaining word:
        for (;;)
        {
            uint64_t temp = 0;
            if (shift != 0) {
                temp = prev >> (64 - shift);
            }
            uint64_t word = 0;

            // If it needs another word:
            if (target > shift) {
                // Generate next word
                word = Random64(prng);
                temp |= (word << shift);
            }

            if (target < 64) {
                temp &= ((uint64_t)1 << target) - 1;
            }

            // Add partial word
            *dest ^= temp;

            if (target <= 64) {
                break;
            }

            target -= 64;
            ++dest;
            prev = word;
        }
    }
}